

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::Calendar::setTimeInMillis(Calendar *this,double millis,UErrorCode *status)

{
  UBool *pUVar1;
  long lVar2;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (millis <= 1.838821689216e+17) {
      if ((millis < -1.84303902528e+17) && (millis = -1.84303902528e+17, this->fLenient == '\0'))
      goto LAB_001f2faa;
    }
    else {
      if (this->fLenient == '\0') {
LAB_001f2faa:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      millis = 1.838821689216e+17;
    }
    this->fTime = millis;
    this->fIsTimeSet = '\x01';
    this->fAreFieldsSet = '\0';
    this->fAreAllFieldsSet = '\0';
    this->fAreFieldsVirtuallySet = '\x01';
    for (lVar2 = -0x17; lVar2 != 0; lVar2 = lVar2 + 1) {
      pUVar1 = this->fIsSet + lVar2 * 4;
      pUVar1[0] = '\0';
      pUVar1[1] = '\0';
      pUVar1[2] = '\0';
      pUVar1[3] = '\0';
      this->fStamp[lVar2 + 0x17] = 0;
      *(undefined1 *)((long)this->fStamp + lVar2 + -1) = 0;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }